

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_> *
__thiscall
Json::OurReader::getStructuredErrors
          (vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
           *__return_storage_ptr__,OurReader *this)

{
  _Elt_pointer pEVar1;
  ErrorInfo *error;
  _Elt_pointer pEVar2;
  _Map_pointer ppEVar3;
  StructuredError structured;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar2 = (this->errors_).
           super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pEVar2 != (this->errors_).
                super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pEVar1 = (this->errors_).
             super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppEVar3 = (this->errors_).
              super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_60._0_8_ = (long)(pEVar2->token_).start_ - (long)this->begin_;
      local_60._8_8_ = (long)(pEVar2->token_).end_ - (long)this->begin_;
      local_50._M_p = (pointer)&local_40;
      std::__cxx11::string::_M_assign((string *)&local_50);
      std::
      vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>::
      push_back(__return_storage_ptr__,(value_type *)local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p);
      }
      pEVar2 = pEVar2 + 1;
      if (pEVar2 == pEVar1) {
        pEVar2 = ppEVar3[1];
        ppEVar3 = ppEVar3 + 1;
        pEVar1 = pEVar2 + 8;
      }
    } while (pEVar2 != (this->errors_).
                       super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<OurReader::StructuredError> OurReader::getStructuredErrors() const {
  std::vector<OurReader::StructuredError> allErrors;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    OurReader::StructuredError structured;
    structured.offset_start = error.token_.start_ - begin_;
    structured.offset_limit = error.token_.end_ - begin_;
    structured.message = error.message_;
    allErrors.push_back(structured);
  }
  return allErrors;
}